

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nap_comm.cpp
# Opt level: O2

void __thiscall RandomCommTest_TestsInTests_Test::TestBody(RandomCommTest_TestsInTests_Test *this)

{
  int *piVar1;
  pointer *this_00;
  pointer *this_01;
  int iVar2;
  uint uVar3;
  mapped_type mVar4;
  void *pvVar5;
  pointer orig_indptr;
  pointer orig_procs;
  pointer orig_indptr_00;
  pointer piVar6;
  int iVar7;
  topo_data *this_02;
  NAPComm *pNVar8;
  mapped_type *pmVar9;
  comm_data *pcVar10;
  int i;
  long lVar11;
  vector<int,_std::allocator<int>_> *pvVar12;
  int i_2;
  long lVar13;
  size_type __n;
  int iVar14;
  int iVar15;
  ulong uVar16;
  topo_data *ptVar17;
  MPIX_Data *pMVar18;
  char *pcVar19;
  int j;
  long lVar20;
  comm_data *pcVar21;
  MPIX_Data *pMVar22;
  pointer piVar23;
  long lVar24;
  ulong uVar25;
  NAPComm *nap_comm;
  bool bVar26;
  pointer in_stack_fffffffffffffc88;
  undefined1 uVar27;
  undefined8 in_stack_fffffffffffffc90;
  comm_data *pcVar28;
  topo_data *abs_error;
  undefined4 uVar29;
  undefined4 in_stack_fffffffffffffcac;
  int in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  int node;
  int local_33c;
  int rank;
  allocator_type local_331;
  NAPComm *local_330;
  comm_data *local_328;
  int local_rank;
  int num_procs_2;
  void *local_318;
  ulong local_310;
  vector<double,_std::allocator<double>_> nap_recv_d_vals;
  vector<double,_std::allocator<double>_> std_recv_d_vals;
  vector<int,_std::allocator<int>_> nap_recv_vals;
  vector<double,_std::allocator<double>_> send_d_vals;
  vector<int,_std::allocator<int>_> std_recv_vals;
  value_type_conflict local_280;
  int rank_2;
  NAPData nap_data;
  vector<int,_std::allocator<int>_> send_vals;
  vector<int,_std::allocator<int>_> send_idx_nodes;
  vector<int,_std::allocator<int>_> recv_node_to_local;
  vector<int,_std::allocator<int>_> recv_nodes;
  vector<int,_std::allocator<int>_> global_send_idx;
  int num_procs;
  int num_procs_1;
  int rank_1;
  int local_num_procs;
  vector<int,_std::allocator<int>_> global_recv_idx;
  MPIX_Data recv_data;
  MPIX_Data send_data;
  
  MPI_Comm_rank(&ompi_mpi_comm_world,&rank);
  MPI_Comm_size(&ompi_mpi_comm_world,&num_procs);
  setenv("PPN","4",1);
  send_data.buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  send_data.buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  send_data.requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  send_data.requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  send_data.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  send_data.requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  send_data.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  send_data.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  send_data.indptr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  send_data.indptr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  send_data.procs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  send_data.indptr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  send_data.buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  send_data.procs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  send_data.procs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  recv_data.buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  recv_data.buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  recv_data.requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  recv_data.requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  recv_data.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  recv_data.requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  recv_data.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  recv_data.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  recv_data.indptr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  recv_data.indptr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  recv_data.procs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  recv_data.indptr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  recv_data.procs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  recv_data.procs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  recv_data.buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  form_initial_communicator(10000,&send_data,&recv_data);
  iVar14 = rank * 10000;
  std::vector<int,_std::allocator<int>_>::vector
            (&global_send_idx,(long)send_data.size_msgs,(allocator_type *)&nap_data);
  std::vector<int,_std::allocator<int>_>::vector
            (&global_recv_idx,(long)recv_data.size_msgs,(allocator_type *)&nap_data);
  lVar13 = 0;
  while (lVar13 < send_data.num_msgs) {
    iVar7 = send_data.procs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar13];
    iVar15 = send_data.indptr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar13];
    iVar2 = send_data.indptr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar13 + 1];
    for (lVar20 = (long)iVar15; lVar20 < iVar2; lVar20 = lVar20 + 1) {
      global_send_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar20] =
           send_data.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar20] + iVar14;
    }
    in_stack_fffffffffffffc88 =
         send_data.requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
         _M_impl.super__Vector_impl_data._M_start + lVar13;
    MPI_Isend(global_send_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + iVar15,iVar2 - iVar15,&ompi_mpi_int,iVar7,0x72aa,
              &ompi_mpi_comm_world,in_stack_fffffffffffffc88);
    lVar13 = lVar13 + 1;
  }
  lVar13 = 0;
  for (lVar20 = 0; uVar29 = (undefined4)((ulong)in_stack_fffffffffffffc88 >> 0x20),
      uVar27 = (undefined1)in_stack_fffffffffffffc90, uVar16 = (ulong)recv_data.num_msgs,
      lVar20 < (long)uVar16; lVar20 = lVar20 + 1) {
    in_stack_fffffffffffffc88 =
         (pointer)(lVar13 + (long)recv_data.requests.
                                  super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
    MPI_Irecv(global_recv_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start +
              recv_data.indptr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar20],
              recv_data.indptr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar20 + 1] -
              recv_data.indptr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar20],&ompi_mpi_int,
              recv_data.procs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar20],0x72aa,&ompi_mpi_comm_world,
              in_stack_fffffffffffffc88);
    lVar13 = lVar13 + 8;
  }
  if (send_data.num_msgs != 0) {
    MPI_Waitall(send_data.num_msgs,
                send_data.requests.
                super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                super__Vector_impl_data._M_start,0);
    uVar16 = (ulong)(uint)recv_data.num_msgs;
  }
  if ((int)uVar16 == 0) {
    local_33c = 0;
  }
  else {
    MPI_Waitall(uVar16,recv_data.requests.
                       super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                       _M_impl.super__Vector_impl_data._M_start,0);
    local_33c = recv_data.num_msgs;
  }
  piVar6 = send_data.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  orig_indptr_00 =
       send_data.indptr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  orig_procs = send_data.procs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
  orig_indptr = recv_data.indptr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  piVar23 = recv_data.procs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  MPI_Comm_rank(&ompi_mpi_comm_world,&rank_1);
  MPI_Comm_size(&ompi_mpi_comm_world,&num_procs_1);
  this_02 = (topo_data *)operator_new(0x18);
  topo_data::topo_data(this_02,(MPI_Comm)&ompi_mpi_comm_world);
  pNVar8 = (NAPComm *)operator_new(0x40);
  NAPComm::NAPComm(pNVar8,this_02);
  send_d_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  send_d_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  send_d_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std_recv_d_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std_recv_d_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std_recv_d_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  map_procs_to_nodes(pNVar8,send_data.num_msgs,orig_procs,orig_indptr_00,
                     (vector<int,_std::allocator<int>_> *)&send_d_vals,
                     (vector<int,_std::allocator<int>_> *)&std_recv_d_vals,
                     (MPI_Comm)CONCAT44(uVar29,1),(bool)uVar27);
  nap_recv_d_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nap_recv_d_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nap_recv_d_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar21 = pNVar8->local_S_comm->send_data;
  pcVar10 = pNVar8->local_S_comm->recv_data;
  pcVar28 = pNVar8->local_L_comm->send_data;
  ptVar17 = (topo_data *)&std_recv_d_vals;
  form_local_comm(send_data.num_msgs,orig_procs,orig_indptr_00,
                  global_send_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,(vector<int,_std::allocator<int>_> *)ptVar17,
                  pcVar21,pcVar10,pcVar28,(vector<int,_std::allocator<int>_> *)&nap_recv_d_vals,
                  (MPI_Comm)this_02,(topo_data *)CONCAT44(in_stack_fffffffffffffcac,0x4c1b),
                  in_stack_fffffffffffffcb0);
  uVar27 = SUB81(pcVar28,0);
  form_global_comm(pNVar8->local_S_comm->recv_data,pNVar8->global_comm->send_data,
                   (vector<int,_std::allocator<int>_> *)&nap_recv_d_vals,(MPI_Comm)this_02,ptVar17,
                   (int)pcVar21);
  iVar14 = local_33c;
  recv_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  recv_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  recv_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  recv_node_to_local.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  recv_node_to_local.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  recv_node_to_local.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  map_procs_to_nodes(pNVar8,local_33c,piVar23,orig_indptr,&recv_nodes,&recv_node_to_local,
                     (MPI_Comm)((ulong)pcVar10 & 0xffffffff00000000),(bool)uVar27);
  send_idx_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  send_idx_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  send_idx_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pcVar21 = pNVar8->local_R_comm->send_data;
  pcVar10 = pNVar8->local_R_comm->recv_data;
  pcVar28 = pNVar8->local_L_comm->recv_data;
  uVar29 = 0x7d30;
  ptVar17 = (topo_data *)&recv_node_to_local;
  abs_error = this_02;
  form_local_comm(iVar14,piVar23,orig_indptr,
                  global_recv_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,(vector<int,_std::allocator<int>_> *)ptVar17,
                  pcVar10,pcVar21,pcVar28,&send_idx_nodes,(MPI_Comm)this_02,
                  (topo_data *)CONCAT44(in_stack_fffffffffffffcac,0x7d30),in_stack_fffffffffffffcb0)
  ;
  form_global_comm(pNVar8->local_R_comm->send_data,pNVar8->global_comm->recv_data,&send_idx_nodes,
                   (MPI_Comm)this_02,ptVar17,(int)pcVar10);
  MPI_Comm_rank(&ompi_mpi_comm_world,&rank_2);
  MPI_Comm_size(&ompi_mpi_comm_world,&num_procs_2);
  MPI_Comm_rank(this_02->local_comm,&local_rank);
  MPI_Comm_size(this_02->local_comm,&local_num_procs);
  __n = (size_type)this_02->num_nodes;
  uVar3 = pNVar8->global_comm->send_data->num_msgs;
  lVar20 = (long)(int)uVar3;
  local_310 = (ulong)pNVar8->global_comm->recv_data->num_msgs;
  std_recv_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&send_vals,__n,(value_type_conflict *)&std_recv_vals,(allocator_type *)&nap_recv_vals);
  nap_recv_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&std_recv_vals,__n,(value_type_conflict *)&nap_recv_vals,(allocator_type *)&local_280);
  lVar13 = local_310 + lVar20;
  iVar14 = (int)lVar13;
  if (iVar14 == 0) {
    local_318 = (void *)0x0;
    local_328 = (comm_data *)0x0;
  }
  else {
    uVar16 = lVar13 * 8;
    if (iVar14 < 0) {
      uVar16 = 0xffffffffffffffff;
    }
    local_328 = (comm_data *)operator_new__(uVar16);
    uVar16 = lVar13 * 4;
    if (iVar14 < 0) {
      uVar16 = 0xffffffffffffffff;
    }
    local_318 = operator_new__(uVar16);
  }
  local_280 = 0;
  local_330 = pNVar8;
  std::vector<int,_std::allocator<int>_>::vector
            (&nap_recv_vals,(long)num_procs_2,&local_280,&local_331);
  lVar24 = 0;
  uVar16 = 0;
  if (0 < (int)uVar3) {
    uVar16 = (ulong)uVar3;
  }
  pcVar10 = local_328;
  for (; pvVar5 = local_318, uVar16 * 4 - lVar24 != 0; lVar24 = lVar24 + 4) {
    node = *(int *)((long)local_330->global_comm->send_data->procs + lVar24);
    lVar11 = (long)this_02->ppn * (long)node + (long)local_rank;
    piVar1 = (int *)(CONCAT44(nap_recv_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              nap_recv_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_) + lVar11 * 4);
    *piVar1 = *piVar1 + 1;
    *(int *)((long)local_318 + lVar24) = local_330->topo_info->rank_node;
    pcVar21 = pcVar10;
    MPI_Isend((long)local_318 + lVar24,1,&ompi_mpi_int,lVar11,0x1ea8c34,&ompi_mpi_comm_world);
    pcVar10 = (comm_data *)&pcVar10->procs;
  }
  uVar25 = 0;
  iVar7 = (int)local_310;
  local_310 = local_310 & 0xffffffff;
  if (iVar7 < 1) {
    local_310 = uVar25;
  }
  pcVar10 = (comm_data *)(&local_328->num_msgs + lVar20 * 2);
  lVar24 = local_310 * 4;
  for (; lVar24 - uVar25 != 0; uVar25 = uVar25 + 4) {
    node = *(int *)((long)local_330->global_comm->recv_data->procs + uVar25);
    lVar11 = (long)this_02->ppn * (long)node + (long)local_rank;
    piVar1 = (int *)(CONCAT44(nap_recv_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              nap_recv_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_) + lVar11 * 4);
    *piVar1 = *piVar1 + 1;
    *(int *)((long)pvVar5 + uVar25 + lVar20 * 4) = local_330->topo_info->rank_node;
    pcVar21 = pcVar10;
    MPI_Isend((long)pvVar5 + uVar25 + lVar20 * 4,1,&ompi_mpi_int,lVar11,0x31f7ce2,
              &ompi_mpi_comm_world);
    pcVar10 = (comm_data *)&pcVar10->procs;
  }
  MPI_Allreduce(1,CONCAT44(nap_recv_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           nap_recv_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_),num_procs_2,&ompi_mpi_int,
                &ompi_mpi_op_sum,&ompi_mpi_comm_world);
  iVar7 = *(int *)(CONCAT44(nap_recv_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            nap_recv_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) + (long)rank_2 * 4);
  iVar15 = 0;
  if (0 < iVar7) {
    iVar15 = iVar7;
  }
  while (pNVar8 = local_330, bVar26 = iVar15 != 0, iVar15 = iVar15 + -1, bVar26) {
    MPI_Probe(0xffffffff,0xffffffff,&ompi_mpi_comm_world,(comm_data *)&nap_data);
    iVar7 = (int)nap_data.send_data;
    iVar2 = nap_data.send_data._4_4_;
    pcVar21 = (comm_data *)&nap_data;
    MPI_Recv(&node,1,&ompi_mpi_int,(ulong)nap_data.send_data & 0xffffffff,nap_data.send_data._4_4_,
             &ompi_mpi_comm_world);
    pvVar12 = &send_vals;
    if (iVar2 == 0x1ea8c34) {
      pvVar12 = &std_recv_vals;
    }
    (pvVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_start[node] = iVar7;
  }
  if (iVar14 != 0) {
    MPI_Waitall(lVar13,local_328,0);
  }
  MPI_Allreduce(1,send_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,__n,&ompi_mpi_int,&ompi_mpi_op_max,
                this_02->local_comm);
  MPI_Allreduce(1,CONCAT44(std_recv_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           std_recv_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_),__n,&ompi_mpi_int,
                &ompi_mpi_op_max,this_02->local_comm);
  for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
    piVar1 = pNVar8->global_comm->send_data->procs;
    node = piVar1[uVar25];
    piVar1[uVar25] =
         send_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[node];
  }
  for (uVar16 = 0; local_310 != uVar16; uVar16 = uVar16 + 1) {
    piVar1 = pNVar8->global_comm->recv_data->procs;
    node = piVar1[uVar16];
    piVar1[uVar16] =
         *(int *)(CONCAT44(std_recv_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           std_recv_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_) + (long)node * 4);
  }
  if (local_328 != (comm_data *)0x0) {
    operator_delete__(local_328);
  }
  if (local_318 != (void *)0x0) {
    operator_delete__(local_318);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&nap_recv_vals.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&std_recv_vals.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&send_vals.super__Vector_base<int,_std::allocator<int>_>);
  uVar3 = orig_indptr[local_33c];
  nap_data.mpi_comm = (MPI_Comm)&nap_data.recv_data;
  nap_data.recv_data = (NAPCommData *)((ulong)nap_data.recv_data._4_4_ << 0x20);
  nap_data.tag = 0;
  nap_data._20_4_ = 0;
  send_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0;
  send_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar25 = 0;
  uVar16 = (ulong)(uint)orig_indptr_00[send_data.num_msgs];
  if (orig_indptr_00[send_data.num_msgs] < 1) {
    uVar16 = uVar25;
  }
  for (; uVar16 * 4 != uVar25; uVar25 = uVar25 + 4) {
    mVar4 = *(mapped_type *)((long)piVar6 + uVar25);
    pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&nap_data,
                        (key_type *)
                        ((long)global_send_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start + uVar25));
    *pmVar9 = mVar4;
  }
  uVar25 = 0;
  uVar16 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar16 = uVar25;
  }
  piVar23 = global_recv_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (; uVar16 != uVar25; uVar25 = uVar25 + 1) {
    pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&send_vals,piVar23);
    *pmVar9 = (mapped_type)uVar25;
    piVar23 = piVar23 + 1;
  }
  comm_data::remove_duplicates(pNVar8->global_comm->send_data);
  comm_data::remove_duplicates(pNVar8->global_comm->recv_data);
  comm_data::remove_duplicates(pNVar8->local_S_comm->send_data);
  comm_data::remove_duplicates(pNVar8->local_S_comm->recv_data);
  comm_data::remove_duplicates(pNVar8->local_R_comm->send_data);
  comm_data::remove_duplicates(pNVar8->local_R_comm->recv_data);
  map_indices(pNVar8->global_comm->send_data,pNVar8->local_S_comm->recv_data);
  map_indices(pNVar8->local_R_comm->send_data,pNVar8->global_comm->recv_data);
  map_indices(pNVar8->local_S_comm->send_data,
              (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
              &nap_data);
  map_indices(pNVar8->local_L_comm->send_data,
              (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
              &nap_data);
  map_indices(pNVar8->local_R_comm->recv_data,
              (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
              &send_vals);
  map_indices(pNVar8->local_L_comm->recv_data,
              (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
              &send_vals);
  piVar1 = pNVar8->local_S_comm->recv_data->indices;
  if (piVar1 != (int *)0x0) {
    operator_delete__(piVar1);
  }
  pcVar10 = pNVar8->global_comm->recv_data;
  if (pcVar10->indices != (int *)0x0) {
    operator_delete__(pcVar10->indices);
    pcVar10 = pNVar8->global_comm->recv_data;
  }
  pNVar8->local_S_comm->recv_data->indices = (int *)0x0;
  pcVar10->indices = (int *)0x0;
  NAPComm::finalize(pNVar8);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)&send_vals);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)&nap_data);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&send_idx_nodes.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&recv_node_to_local.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&recv_nodes.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&nap_recv_d_vals);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&std_recv_d_vals);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&send_d_vals);
  std::vector<int,_std::allocator<int>_>::vector(&send_vals,10000,(allocator_type *)&nap_data);
  for (lVar13 = 0; lVar13 != 10000; lVar13 = lVar13 + 1) {
    send_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar13] = rank * 10000 + (int)lVar13;
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&std_recv_vals,(long)recv_data.size_msgs,(allocator_type *)&nap_data);
  std::vector<int,_std::allocator<int>_>::vector
            (&nap_recv_vals,(long)recv_data.size_msgs,(allocator_type *)&nap_data);
  iVar14 = 0x153418;
  pMVar18 = &send_data;
  pMVar22 = &recv_data;
  standard_communication<int>
            (&send_vals,&std_recv_vals,0xc0c1,(MPI_Datatype)&ompi_mpi_int,pMVar18,pMVar22);
  nap_data.send_data = (NAPCommData *)0x0;
  nap_data.recv_data = (NAPCommData *)0x0;
  MPIX_INAPsend(send_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,pNVar8,(MPI_Datatype)&nap_data,iVar14,
                (MPI_Comm)pMVar18,(NAPData *)pMVar22);
  MPIX_INAPrecv((void *)CONCAT44(nap_recv_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_start._4_4_,
                                 nap_recv_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_start._0_4_),pNVar8,
                (MPI_Datatype)&nap_data,iVar14,(MPI_Comm)pMVar18,(NAPData *)pMVar22);
  MPIX_NAPwait(pNVar8,&nap_data);
  this_00 = &send_d_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  lVar20 = 0;
  for (lVar13 = 0; lVar13 < recv_data.size_msgs; lVar13 = lVar13 + 1) {
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&send_d_vals,"std_recv_vals[i]","nap_recv_vals[i]",
               (int *)(CONCAT44(std_recv_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                std_recv_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_) + lVar20),
               (int *)(CONCAT44(nap_recv_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                nap_recv_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_) + lVar20));
    if ((char)send_d_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&std_recv_d_vals);
      if (send_d_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish == (pointer)0x0) {
        pcVar19 = "";
      }
      else {
        pcVar19 = (char *)*send_d_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&nap_recv_d_vals,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bienz2[P]Streamline/tests/test_nap_comm.cpp"
                 ,0xfd,pcVar19);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&nap_recv_d_vals,(Message *)&std_recv_d_vals);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nap_recv_d_vals);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&std_recv_d_vals);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)this_00);
      goto LAB_001233cf;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
    lVar20 = lVar20 + 4;
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&send_d_vals,10000,(allocator_type *)&std_recv_d_vals);
  pNVar8 = local_330;
  for (lVar13 = 0; lVar13 != 10000; lVar13 = lVar13 + 1) {
    send_vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar13] = rank * 10000 + (int)lVar13;
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&std_recv_d_vals,(long)recv_data.size_msgs,(allocator_type *)&nap_recv_d_vals);
  std::vector<double,_std::allocator<double>_>::vector
            (&nap_recv_d_vals,(long)recv_data.size_msgs,(allocator_type *)&recv_nodes);
  iVar14 = 0x153418;
  pMVar18 = &send_data;
  pMVar22 = &recv_data;
  standard_communication<double>
            (&send_d_vals,&std_recv_d_vals,0xc0c1,(MPI_Datatype)&ompi_mpi_int,pMVar18,pMVar22);
  MPIX_INAPsend(send_d_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,pNVar8,(MPI_Datatype)&nap_data,iVar14,
                (MPI_Comm)pMVar18,(NAPData *)pMVar22);
  MPIX_INAPrecv(nap_recv_d_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,pNVar8,(MPI_Datatype)&nap_data,iVar14,
                (MPI_Comm)pMVar18,(NAPData *)pMVar22);
  MPIX_NAPwait(pNVar8,&nap_data);
  this_01 = &recv_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  lVar13 = 0;
  do {
    pNVar8 = local_330;
    if (recv_data.size_msgs <= lVar13) {
      ptVar17 = local_330->topo_info;
      if (ptVar17 != (topo_data *)0x0) {
        topo_data::~topo_data(ptVar17);
      }
      operator_delete(ptVar17);
      NAPComm::~NAPComm(pNVar8);
      operator_delete(pNVar8);
      setenv("PPN","16",1);
LAB_001233ab:
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&nap_recv_d_vals.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&std_recv_d_vals.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&send_d_vals.super__Vector_base<double,_std::allocator<double>_>);
LAB_001233cf:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&nap_recv_vals.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&std_recv_vals.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&send_vals.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&global_recv_idx.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&global_send_idx.super__Vector_base<int,_std::allocator<int>_>);
      MPIX_Data::~MPIX_Data(&recv_data);
      MPIX_Data::~MPIX_Data(&send_data);
      return;
    }
    testing::internal::DoubleNearPredFormat
              ((char *)pcVar28,(char *)pcVar21,(char *)0x123260,
               (double)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
               (double)CONCAT44(in_stack_fffffffffffffcac,uVar29),(double)abs_error);
    if ((char)recv_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start == '\0') {
      testing::Message::Message((Message *)&recv_node_to_local);
      if (recv_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish == (pointer)0x0) {
        pcVar19 = "";
      }
      else {
        pcVar19 = *(char **)recv_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&send_idx_nodes,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bienz2[P]Streamline/tests/test_nap_comm.cpp"
                 ,0x114,pcVar19);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&send_idx_nodes,(Message *)&recv_node_to_local);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&send_idx_nodes);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&recv_node_to_local);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)this_01);
      goto LAB_001233ab;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_01);
    lVar13 = lVar13 + 1;
  } while( true );
}

Assistant:

TEST(RandomCommTest, TestsInTests)
{
    // Get MPI Information
    int rank, num_procs;
    MPI_Comm_rank(MPI_COMM_WORLD, &rank);
    MPI_Comm_size(MPI_COMM_WORLD, &num_procs);

    setenv("PPN", "4", 1);

    // Initial communication info (standard)
    int local_size = 10000; // Number of variables each rank stores
    MPIX_Data send_data;
    MPIX_Data recv_data;
    form_initial_communicator(local_size, &send_data, &recv_data);

    // Determine unique global indices (map from send indices to recv indicies)
    int first = local_size * rank;
    std::vector<int> global_send_idx(send_data.size_msgs);
    std::vector<int> global_recv_idx(recv_data.size_msgs);
    int tag = 29354;
    for (int i = 0; i < send_data.num_msgs; i++)
    {
        int proc = send_data.procs[i];
        int start = send_data.indptr[i];
        int end = send_data.indptr[i+1];
        for (int j = start; j < end; j++)
        {
            int idx = send_data.indices[j];
            global_send_idx[j] = first + idx;
        }
        MPI_Isend(&global_send_idx[start], end - start, MPI_INT, proc,
                tag, MPI_COMM_WORLD, &send_data.requests[i]);
    }
    for (int i = 0; i < recv_data.num_msgs; i++)
    {
        int proc = recv_data.procs[i];
        int start = recv_data.indptr[i];
        int end = recv_data.indptr[i+1];
        MPI_Irecv(&global_recv_idx[start], end - start, MPI_INT, proc,
                tag, MPI_COMM_WORLD, &recv_data.requests[i]);
    }
    if (send_data.num_msgs) MPI_Waitall(send_data.num_msgs, 
            send_data.requests.data(), MPI_STATUSES_IGNORE);
    if (recv_data.num_msgs) MPI_Waitall(recv_data.num_msgs, 
            recv_data.requests.data(), MPI_STATUSES_IGNORE);

    // Initializing node-aware communication package
    NAPComm* nap_comm;
    MPIX_NAPinit(send_data.num_msgs, send_data.procs.data(), 
            send_data.indptr.data(), send_data.indices.data(), 
            recv_data.num_msgs, recv_data.procs.data(), 
            recv_data.indptr.data(), global_send_idx.data(),
            global_recv_idx.data(), MPI_COMM_WORLD, &nap_comm);

    // Test correctness of communication
    std::vector<int> send_vals(local_size);
    int val = local_size*rank;
    for (int i = 0; i < local_size; i++)
    {
        send_vals[i] = val++;
    }
    std::vector<int> std_recv_vals(recv_data.size_msgs);
    std::vector<int> nap_recv_vals(recv_data.size_msgs);

    // 1. Standard Communication
    standard_communication(send_vals, std_recv_vals, 49345, MPI_INT, &send_data, &recv_data);

    // 2. Node-Aware Communication
    NAPData nap_data;
    MPIX_INAPsend(send_vals.data(), nap_comm, MPI_INT, 20423, MPI_COMM_WORLD, &nap_data);
    MPIX_INAPrecv(nap_recv_vals.data(), nap_comm, MPI_INT, 20423, MPI_COMM_WORLD, &nap_data);
    MPIX_NAPwait(nap_comm, &nap_data);

    // 3. Compare std_recv_vals and nap_recv_vals
    for (int i = 0; i < recv_data.size_msgs; i++)
    {
        ASSERT_EQ(std_recv_vals[i], nap_recv_vals[i]);
    }
    
    std::vector<double> send_d_vals(local_size);
    val = local_size*rank;
    for (int i = 0; i < local_size; i++)
    {
        send_vals[i] = val++;
    }
    std::vector<double> std_recv_d_vals(recv_data.size_msgs);
    std::vector<double> nap_recv_d_vals(recv_data.size_msgs);

    // 1. Standard Communication
    standard_communication(send_d_vals, std_recv_d_vals, 49345, MPI_INT, &send_data, &recv_data);

    // 2. Node-Aware Communication
    MPIX_INAPsend(send_d_vals.data(), nap_comm, MPI_INT, 20423, MPI_COMM_WORLD, &nap_data);
    MPIX_INAPrecv(nap_recv_d_vals.data(), nap_comm, MPI_INT, 20423, MPI_COMM_WORLD, &nap_data);
    MPIX_NAPwait(nap_comm, &nap_data);

    // 3. Compare std_recv_vals and nap_recv_vals
    for (int i = 0; i < recv_data.size_msgs; i++)
    {
        ASSERT_NEAR(std_recv_d_vals[i], nap_recv_d_vals[i], 1e-10);
    }

    MPIX_NAPDestroy(&nap_comm);

    setenv("PPN", "16", 1);
}